

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O0

H265eDpbFrm * get_ref_pic(H265eDpbFrm *frame_list,RK_S32 poc)

{
  H265eDpbFrm *local_20;
  H265eDpbFrm *frame;
  RK_S32 index;
  RK_S32 poc_local;
  H265eDpbFrm *frame_list_local;
  
  local_20 = (H265eDpbFrm *)0x0;
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","enter\n","get_ref_pic");
  }
  frame._0_4_ = 0;
  while (((int)frame < 0x10 &&
         ((local_20 = frame_list + (int)frame, local_20->inited == 0 || (local_20->poc != poc))))) {
    frame._0_4_ = (int)frame + 1;
  }
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","leave\n","get_ref_pic");
  }
  return local_20;
}

Assistant:

H265eDpbFrm* get_ref_pic(H265eDpbFrm *frame_list, RK_S32 poc)
{
    RK_S32 index = 0;
    H265eDpbFrm *frame = NULL;

    h265e_dbg_func("enter\n");
    for (index = 0; index < MAX_REFS; index++) {
        frame = &frame_list[index];
        if (frame->inited && frame->poc == poc) {
            break;
        }
    }
    h265e_dbg_func("leave\n");
    return frame;
}